

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolsb.c
# Opt level: O0

int ffgsfsb(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
           char *array,char *flagval,int *anynul,int *status)

{
  int iVar1;
  long lVar2;
  char local_328 [4];
  int nullcheck;
  char msg [81];
  int local_2c8;
  int iStack_2c4;
  char nulval;
  int anyf;
  int hdutype;
  long numcol;
  long ninc;
  long nultyp;
  long nelem;
  long felem;
  LONGLONG trcll [9];
  LONGLONG local_248;
  LONGLONG blcll [9];
  long lStack_1f8;
  long dsize [10];
  long incr [9];
  long local_158;
  long stp [9];
  long local_108;
  long str [9];
  long rinc;
  long rstp;
  long rstr;
  long row;
  long i8;
  long i7;
  long i6;
  long i5;
  long i4;
  long i3;
  long i2;
  long i1;
  long i0;
  long ii;
  long *trc_local;
  long *blc_local;
  long *naxes_local;
  int naxis_local;
  int colnum_local;
  fitsfile *fptr_local;
  
  if ((naxis < 1) || (9 < naxis)) {
    snprintf(local_328,0x51,"NAXIS = %d in call to ffgsvsb is out of range",(ulong)(uint)naxis);
    ffpmsg(local_328);
    *status = 0x140;
    fptr_local._4_4_ = 0x140;
  }
  else {
    iVar1 = fits_is_compressed_image(fptr,status);
    if (iVar1 == 0) {
      iVar1 = ffghdt(fptr,&stack0xfffffffffffffd3c,status);
      if (iVar1 < 1) {
        if (iStack_2c4 == 0) {
          if (colnum == 0) {
            rstp = 1;
            rinc = 1;
          }
          else {
            rstp = (long)colnum;
            rinc = (long)colnum;
          }
          str[8] = 1;
          _anyf = 2;
        }
        else {
          rstp = blc[naxis];
          rinc = trc[naxis];
          str[8] = inc[naxis];
          _anyf = (long)colnum;
        }
        ninc = 2;
        if (anynul != (int *)0x0) {
          *anynul = 0;
        }
        i1 = 0;
        for (i0 = 0; i0 < 9; i0 = i0 + 1) {
          str[i0 + -1] = 1;
          stp[i0 + -1] = 1;
          dsize[i0 + 9] = 1;
          dsize[i0 + -1] = 1;
        }
        for (i0 = 0; i0 < naxis; i0 = i0 + 1) {
          if (trc[i0] < blc[i0]) {
            snprintf(local_328,0x51,"ffgsvsb: illegal range specified for axis %ld",i0 + 1);
            ffpmsg(local_328);
            *status = 0x141;
            return 0x141;
          }
          str[i0 + -1] = blc[i0];
          stp[i0 + -1] = trc[i0];
          dsize[i0 + 9] = inc[i0];
          dsize[i0] = dsize[i0 + -1] * naxes[i0];
        }
        if ((naxis == 1) && (*naxes == 1)) {
          lVar2 = (rinc - rstp) / str[8];
          numcol = str[8];
          rinc = rstp;
        }
        else {
          lVar2 = (local_158 - local_108) / *inc;
          numcol = dsize[9];
        }
        nultyp = lVar2 + 1;
        for (rstr = rstp; rstr <= rinc; rstr = str[8] + rstr) {
          for (row = str[7]; row <= stp[7]; row = incr[7] + row) {
            for (i8 = str[6]; i8 <= stp[6]; i8 = incr[6] + i8) {
              for (i7 = str[5]; i7 <= stp[5]; i7 = incr[5] + i7) {
                for (i6 = str[4]; i6 <= stp[4]; i6 = incr[4] + i6) {
                  for (i5 = str[3]; i5 <= stp[3]; i5 = incr[3] + i5) {
                    for (i4 = str[2]; i4 <= stp[2]; i4 = incr[2] + i4) {
                      for (i3 = str[1]; i3 <= stp[1]; i3 = incr[1] + i3) {
                        for (i2 = str[0]; i2 <= stp[0]; i2 = incr[0] + i2) {
                          nelem = local_108 + (i2 + -1) * dsize[0] + (i3 + -1) * dsize[1] +
                                  (i4 + -1) * dsize[2] + (i5 + -1) * dsize[3] + (i6 + -1) * dsize[4]
                                  + (i7 + -1) * dsize[5] + (i8 + -1) * dsize[6] +
                                  (row + -1) * dsize[7];
                          iVar1 = ffgclsb(fptr,(int)_anyf,rstr,nelem,nultyp,numcol,(int)ninc,'\0',
                                          array + i1,flagval + i1,&local_2c8,status);
                          if (0 < iVar1) {
                            return *status;
                          }
                          if ((local_2c8 != 0) && (anynul != (int *)0x0)) {
                            *anynul = 1;
                          }
                          i1 = nultyp + i1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        fptr_local._4_4_ = *status;
      }
      else {
        fptr_local._4_4_ = *status;
      }
    }
    else {
      for (i0 = 0; i0 < naxis; i0 = i0 + 1) {
        blcll[i0 + -1] = blc[i0];
        trcll[i0 + -1] = trc[i0];
      }
      fits_read_compressed_img
                (fptr,0xc,&local_248,&felem,inc,2,(void *)0x0,array,flagval,anynul,status);
      fptr_local._4_4_ = *status;
    }
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgsfsb(fitsfile *fptr, /* I - FITS file pointer                        */
           int  colnum,    /* I - number of the column to read (1 = 1st)    */
           int naxis,      /* I - number of dimensions in the FITS array    */
           long  *naxes,   /* I - size of each dimension                    */
           long  *blc,     /* I - 'bottom left corner' of the subsection    */
           long  *trc,     /* I - 'top right corner' of the subsection      */
           long  *inc,     /* I - increment to be applied in each dimension */
           signed char *array,   /* O - array to be filled and returned     */
           char *flagval,  /* O - set to 1 if corresponding value is null   */
           int  *anynul,   /* O - set to 1 if any values are null; else 0   */
           int  *status)   /* IO - error status                             */
/*
  Read a subsection of data values from an image or a table column.
  This routine is set up to handle a maximum of nine dimensions.
*/
{
    long ii,i0, i1,i2,i3,i4,i5,i6,i7,i8,row,rstr,rstp,rinc;
    long str[9],stp[9],incr[9],dsize[10];
    LONGLONG blcll[9], trcll[9];
    long felem, nelem, nultyp, ninc, numcol;
    int hdutype, anyf;
    signed char nulval = 0;
    char msg[FLEN_ERRMSG];
    int  nullcheck = 2;

    if (naxis < 1 || naxis > 9)
    {
        snprintf(msg, FLEN_ERRMSG,"NAXIS = %d in call to ffgsvsb is out of range", naxis);
        ffpmsg(msg);
        return(*status = BAD_DIMEN);
    }

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        for (ii=0; ii < naxis; ii++) {
	    blcll[ii] = blc[ii];
	    trcll[ii] = trc[ii];
	}

        fits_read_compressed_img(fptr, TSBYTE, blcll, trcll, inc,
            nullcheck, NULL, array, flagval, anynul, status);
        return(*status);
    }

/*
    if this is a primary array, then the input COLNUM parameter should
    be interpreted as the row number, and we will alway read the image
    data from column 2 (any group parameters are in column 1).
*/
    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == IMAGE_HDU)
    {
        /* this is a primary array, or image extension */
        if (colnum == 0)
        {
            rstr = 1;
            rstp = 1;
        }
        else
        {
            rstr = colnum;
            rstp = colnum;
        }
        rinc = 1;
        numcol = 2;
    }
    else
    {
        /* this is a table, so the row info is in the (naxis+1) elements */
        rstr = blc[naxis];
        rstp = trc[naxis];
        rinc = inc[naxis];
        numcol = colnum;
    }

    nultyp = 2;
    if (anynul)
        *anynul = FALSE;

    i0 = 0;
    for (ii = 0; ii < 9; ii++)
    {
        str[ii] = 1;
        stp[ii] = 1;
        incr[ii] = 1;
        dsize[ii] = 1;
    }

    for (ii = 0; ii < naxis; ii++)
    {
      if (trc[ii] < blc[ii])
      {
        snprintf(msg, FLEN_ERRMSG,"ffgsvsb: illegal range specified for axis %ld", ii + 1);
        ffpmsg(msg);
        return(*status = BAD_PIX_NUM);
      }

      str[ii] = blc[ii];
      stp[ii] = trc[ii];
      incr[ii] = inc[ii];
      dsize[ii + 1] = dsize[ii] * naxes[ii];
    }

    if (naxis == 1 && naxes[0] == 1)
    {
      /* This is not a vector column, so read all the rows at once */
      nelem = (rstp - rstr) / rinc + 1;
      ninc = rinc;
      rstp = rstr;
    }
    else
    {
      /* have to read each row individually, in all dimensions */
      nelem = (stp[0] - str[0]) / inc[0] + 1;
      ninc = incr[0];
    }

    for (row = rstr; row <= rstp; row += rinc)
    {
     for (i8 = str[8]; i8 <= stp[8]; i8 += incr[8])
     {
      for (i7 = str[7]; i7 <= stp[7]; i7 += incr[7])
      {
       for (i6 = str[6]; i6 <= stp[6]; i6 += incr[6])
       {
        for (i5 = str[5]; i5 <= stp[5]; i5 += incr[5])
        {
         for (i4 = str[4]; i4 <= stp[4]; i4 += incr[4])
         {
          for (i3 = str[3]; i3 <= stp[3]; i3 += incr[3])
          {
           for (i2 = str[2]; i2 <= stp[2]; i2 += incr[2])
           {
            for (i1 = str[1]; i1 <= stp[1]; i1 += incr[1])
            {
              felem=str[0] + (i1 - 1) * dsize[1] + (i2 - 1) * dsize[2] + 
                             (i3 - 1) * dsize[3] + (i4 - 1) * dsize[4] +
                             (i5 - 1) * dsize[5] + (i6 - 1) * dsize[6] +
                             (i7 - 1) * dsize[7] + (i8 - 1) * dsize[8];

              if ( ffgclsb(fptr, numcol, row, felem, nelem, ninc, nultyp,
                   nulval, &array[i0], &flagval[i0], &anyf, status) > 0)
                   return(*status);

              if (anyf && anynul)
                  *anynul = TRUE;

              i0 += nelem;
            }
           }
          }
         }
        }
       }
      }
     }
    }
    return(*status);
}